

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_serialize_set_element
          (t_cpp_generator *this,ostream *out,t_set *tset,string *iter)

{
  t_type *type;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  t_field efield;
  string *iter_local;
  t_set *tset_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  efield._168_8_ = iter;
  type = t_set::get_elem_type(tset);
  std::operator+(&local_118,"(*",iter);
  std::operator+(&local_f8,&local_118,")");
  t_field::t_field((t_field *)local_d8,type,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",&local_171);
  generate_serialize_field(this,out,(t_field *)local_d8,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  t_field::~t_field((t_field *)local_d8);
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_set_element(ostream& out, t_set* tset, string iter) {
  t_field efield(tset->get_elem_type(), "(*" + iter + ")");
  generate_serialize_field(out, &efield, "");
}